

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-matchers.h
# Opt level: O0

void __thiscall testing::Matcher<const_long_&>::Matcher(Matcher<const_long_&> *this,long *value)

{
  ComparisonBase<testing::internal::EqMatcher<long>,_long,_std::equal_to<void>_> local_38;
  Matcher<const_long_&> local_30;
  long *local_18;
  long *value_local;
  Matcher<const_long_&> *this_local;
  
  local_18 = value;
  value_local = (long *)this;
  internal::MatcherBase<const_long_&>::MatcherBase(&this->super_MatcherBase<const_long_&>);
  (this->super_MatcherBase<const_long_&>).super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__Matcher_00290420;
  local_38.rhs_ = (long)Eq<long>(*local_18);
  Matcher<long_const&>::Matcher<testing::internal::EqMatcher<long>,void>
            ((Matcher<long_const&> *)&local_30,(EqMatcher<long> *)&local_38);
  operator=(this,&local_30);
  ~Matcher(&local_30);
  return;
}

Assistant:

Matcher<T>::Matcher(T value) {
  *this = Eq(value);
}